

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O2

bool ft::operator==(set<int,_ft::less<int>,_ft::allocator<int>_> *lhs,
                   set<int,_ft::less<int>,_ft::allocator<int>_> *rhs)

{
  bool bVar1;
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> local_50;
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> local_38;
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> local_20;
  
  if ((lhs->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
      super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_size ==
      (rhs->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
      super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_size) {
    local_50.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>.m_tree =
         &(lhs->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
          super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree;
    local_50.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>.m_node =
         ((lhs->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
          super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_first)->parent;
    local_50.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>._vptr_treeIterator =
         (_func_int **)&PTR__treeIterator_0010dc90;
    local_38.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>.m_node =
         (lhs->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
         super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_last;
    local_38.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>._vptr_treeIterator =
         (_func_int **)&PTR__treeIterator_0010dc90;
    local_20.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>.m_tree =
         &(rhs->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
          super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree;
    local_20.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>.m_node =
         ((rhs->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
          super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree.m_first)->parent;
    local_20.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>._vptr_treeIterator =
         (_func_int **)&PTR__treeIterator_0010dc90;
    local_38.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>.m_tree =
         local_50.super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>.m_tree;
    bVar1 = equal<ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>>
                      (&local_50,&local_38,&local_20,(type *)0x0,(type *)0x0);
    return bVar1;
  }
  return false;
}

Assistant:

size_type	size() const { return this->m_size; }